

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_solveRealLPAndRecordStatistics
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,bool *interrupt)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  Representation RVar1;
  Tolerances *pTVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Statistics *pSVar4;
  bool bVar5;
  int iVar6;
  undefined8 uVar7;
  int iVar8;
  Type TVar9;
  Settings *pSVar10;
  int iVar11;
  Verbosity old_verbosity;
  Representation RVar12;
  Type tp;
  bool bVar13;
  double extraout_XMM0_Qa;
  Real RVar14;
  double dVar15;
  double dVar16;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  undefined4 uVar17;
  undefined4 uVar18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_268;
  cpp_dec_float<100U,_int,_void> local_218;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  uint uStack_190;
  uint uStack_18c;
  int iStack_188;
  bool bStack_184;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined5 uStack_140;
  undefined3 uStack_13b;
  int iStack_138;
  bool bStack_134;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined5 uStack_f0;
  undefined3 uStack_eb;
  int iStack_e8;
  bool bStack_e4;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined5 uStack_a0;
  undefined3 uStack_9b;
  int iStack_98;
  bool bStack_94;
  undefined8 local_90;
  undefined8 local_88;
  uint auStack_80 [13];
  undefined3 uStack_4b;
  int iStack_48;
  undefined1 uStack_44;
  undefined8 local_40;
  
  pSVar10 = this->_currentSettings;
  dVar15 = pSVar10->_realParamValues[6];
  iVar8 = -1;
  if ((double)pSVar10->_intParamValues[5] < dVar15) {
    iVar11 = pSVar10->_intParamValues[5] - this->_statistics->iterations;
    iVar8 = -1;
    if (-1 < iVar11) {
      iVar8 = iVar11;
    }
  }
  bVar13 = this->_hasBasis;
  (this->_solver).maxIters = iVar8;
  dVar16 = pSVar10->_realParamValues[7];
  if (dVar16 < dVar15) {
    (*this->_statistics->solvingTime->_vptr_Timer[6])();
    dVar15 = dVar16 - extraout_XMM0_Qa;
  }
  uVar17 = 0;
  uVar18 = 0;
  if (0.0 <= dVar15) {
    uVar17 = SUB84(dVar15,0);
    uVar18 = (undefined4)((ulong)dVar15 >> 0x20);
  }
  (this->_solver).maxTime = (Real)CONCAT44(uVar18,uVar17);
  RVar14 = Tolerances::epsilon((this->_solver).
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  local_40._0_4_ = cpp_dec_float_finite;
  local_40._4_4_ = 0x10;
  local_88._0_4_ = 0;
  local_88._4_4_ = 0;
  auStack_80[0] = 0;
  auStack_80[1] = 0;
  auStack_80[2] = 0;
  auStack_80[3] = 0;
  auStack_80[4] = 0;
  auStack_80[5] = 0;
  auStack_80[6] = 0;
  auStack_80[7] = 0;
  auStack_80[8] = 0;
  auStack_80[9] = 0;
  auStack_80[10] = 0;
  auStack_80[0xb] = 0;
  stack0xffffffffffffffb0 = 0;
  uStack_4b = 0;
  iStack_48 = 0;
  uStack_44 = 0;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_88,RVar14);
  local_268.fpclass = cpp_dec_float_finite;
  local_268.prec_elem = 0x10;
  local_268.data._M_elems[0] = 0;
  local_268.data._M_elems[1] = 0;
  local_268.data._M_elems[2] = 0;
  local_268.data._M_elems[3] = 0;
  local_268.data._M_elems[4] = 0;
  local_268.data._M_elems[5] = 0;
  local_268.data._M_elems[6] = 0;
  local_268.data._M_elems[7] = 0;
  local_268.data._M_elems[8] = 0;
  local_268.data._M_elems[9] = 0;
  local_268.data._M_elems[10] = 0;
  local_268.data._M_elems[0xb] = 0;
  local_268.data._M_elems[0xc] = 0;
  local_268.data._M_elems[0xd] = 0;
  local_268.data._M_elems._56_5_ = 0;
  local_268.data._M_elems[0xf]._1_3_ = 0;
  local_268.exp = 0;
  local_268.neg = false;
  local_218.fpclass = cpp_dec_float_finite;
  local_218.prec_elem = 0x10;
  local_218.data._M_elems[0] = 0;
  local_218.data._M_elems[1] = 0;
  local_218.data._M_elems[2] = 0;
  local_218.data._M_elems[3] = 0;
  local_218.data._M_elems[4] = 0;
  local_218.data._M_elems[5] = 0;
  local_218.data._M_elems[6] = 0;
  local_218.data._M_elems[7] = 0;
  local_218.data._M_elems[8] = 0;
  local_218.data._M_elems[9] = 0;
  local_218.data._M_elems[10] = 0;
  local_218.data._M_elems[0xb] = 0;
  local_218.data._M_elems[0xc] = 0;
  local_218.data._M_elems[0xd] = 0;
  local_218.data._M_elems._56_5_ = 0;
  local_218.data._M_elems[0xf]._1_3_ = 0;
  local_218.exp = 0;
  local_218.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_218,10000.0);
  local_268.data._M_elems[0] = (uint)local_88;
  local_268.data._M_elems[1] = local_88._4_4_;
  local_268.data._M_elems[2] = auStack_80[0];
  local_268.data._M_elems[3] = auStack_80[1];
  local_268.data._M_elems[4] = auStack_80[2];
  local_268.data._M_elems[5] = auStack_80[3];
  local_268.data._M_elems[6] = auStack_80[4];
  local_268.data._M_elems[7] = auStack_80[5];
  local_268.data._M_elems[8] = auStack_80[6];
  local_268.data._M_elems[9] = auStack_80[7];
  local_268.data._M_elems[10] = auStack_80[8];
  local_268.data._M_elems[0xb] = auStack_80[9];
  local_268.data._M_elems[0xc] = auStack_80[10];
  local_268.data._M_elems[0xd] = auStack_80[0xb];
  local_268.data._M_elems._56_5_ = stack0xffffffffffffffb0;
  local_268.data._M_elems[0xf]._1_3_ = uStack_4b;
  local_268.exp = iStack_48;
  local_268.neg = (bool)uStack_44;
  local_268.fpclass = (fpclass_type)local_40;
  local_268.prec_elem = local_40._4_4_;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_268,&local_218)
  ;
  pTVar2 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  RVar14 = Tolerances::floatingPointFeastol(pTVar2);
  bVar5 = false;
  if ((!NAN(RVar14)) && (local_268.fpclass != cpp_dec_float_NaN)) {
    local_218.fpclass = cpp_dec_float_finite;
    local_218.prec_elem = 0x10;
    local_218.data._M_elems[0] = 0;
    local_218.data._M_elems[1] = 0;
    local_218.data._M_elems[2] = 0;
    local_218.data._M_elems[3] = 0;
    local_218.data._M_elems[4] = 0;
    local_218.data._M_elems[5] = 0;
    local_218.data._M_elems[6] = 0;
    local_218.data._M_elems[7] = 0;
    local_218.data._M_elems[8] = 0;
    local_218.data._M_elems[9] = 0;
    local_218.data._M_elems[10] = 0;
    local_218.data._M_elems[0xb] = 0;
    local_218.data._M_elems[0xc] = 0;
    local_218.data._M_elems[0xd] = 0;
    local_218.data._M_elems._56_5_ = 0;
    local_218.data._M_elems[0xf]._1_3_ = 0;
    local_218.exp = 0;
    local_218.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_218,RVar14);
    iVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                      (&local_268,&local_218);
    bVar5 = 0 < iVar8;
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if (bVar5) {
    pTVar2 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var3 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    dVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::extract_double
                       (&local_268);
    Tolerances::setFloatingPointFeastol(pTVar2,dVar15);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
  }
  pTVar2 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  RVar14 = Tolerances::floatingPointOpttol(pTVar2);
  bVar5 = false;
  if ((!NAN(RVar14)) && (bVar5 = false, local_268.fpclass != cpp_dec_float_NaN)) {
    local_218.fpclass = cpp_dec_float_finite;
    local_218.prec_elem = 0x10;
    local_218.data._M_elems[0] = 0;
    local_218.data._M_elems[1] = 0;
    local_218.data._M_elems[2] = 0;
    local_218.data._M_elems[3] = 0;
    local_218.data._M_elems[4] = 0;
    local_218.data._M_elems[5] = 0;
    local_218.data._M_elems[6] = 0;
    local_218.data._M_elems[7] = 0;
    local_218.data._M_elems[8] = 0;
    local_218.data._M_elems[9] = 0;
    local_218.data._M_elems[10] = 0;
    local_218.data._M_elems[0xb] = 0;
    local_218.data._M_elems[0xc] = 0;
    local_218.data._M_elems[0xd] = 0;
    local_218.data._M_elems._56_5_ = 0;
    local_218.data._M_elems[0xf]._1_3_ = 0;
    local_218.exp = 0;
    local_218.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_218,RVar14);
    iVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                      (&local_268,&local_218);
    bVar5 = 0 < iVar8;
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if (bVar5) {
    pTVar2 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var3 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    dVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::extract_double
                       (&local_268);
    Tolerances::setFloatingPointOpttol(pTVar2,dVar15);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
  }
  this_00 = &this->_solver;
  iVar8 = this->_currentSettings->_intParamValues[1];
  if (iVar8 == 2) {
    RVar12 = ROW;
    if ((this->_solver).theRep != ROW) {
LAB_00498881:
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::initRep(this_00,RVar12);
    }
  }
  else if (iVar8 == 1) {
    RVar12 = COLUMN;
    if ((this->_solver).theRep != COLUMN) goto LAB_00498881;
  }
  else if (iVar8 == 0) {
    dVar16 = (double)((this->_solver).
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum + 1) * this->_currentSettings->_realParamValues[0x10];
    dVar15 = (double)((this->_solver).
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum + 1);
    RVar1 = (this->_solver).theRep;
    RVar12 = COLUMN;
    if ((RVar1 != COLUMN && dVar15 <= dVar16) || (RVar12 = ROW, RVar1 != ROW && dVar16 < dVar15))
    goto LAB_00498881;
  }
  iVar8 = this->_currentSettings->_intParamValues[2];
  if (iVar8 == 1) {
    TVar9 = (this->_solver).theType;
    RVar12 = (this->_solver).theRep;
    tp = ENTER;
    if (TVar9 == ENTER || RVar12 != ROW) {
      if (RVar12 != COLUMN) goto LAB_00498901;
LAB_004988ef:
      tp = LEAVE;
      if (TVar9 == LEAVE) goto LAB_00498901;
    }
  }
  else {
    if (iVar8 != 0) goto LAB_00498901;
    TVar9 = (this->_solver).theType;
    RVar12 = (this->_solver).theRep;
    tp = ENTER;
    if (TVar9 == ENTER || RVar12 != COLUMN) {
      if (RVar12 != ROW) goto LAB_00498901;
      goto LAB_004988ef;
    }
  }
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setType(this_00,tp);
LAB_00498901:
  local_90 = 0x1000000000;
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  uStack_9b = 0;
  iStack_98 = 0;
  bStack_94 = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_d8,this->_currentSettings->_realParamValues[0xf]
            );
  *(undefined8 *)(this->_solver).sparsePricingFactor.m_backend.data._M_elems = local_d8;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 2) = uStack_d0;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 4) = local_c8;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 6) = uStack_c0;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 8) = local_b8;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 10) = uStack_b0;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 0xc) = local_a8;
  *(ulong *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 0xe) =
       CONCAT35(uStack_9b,uStack_a0);
  (this->_solver).sparsePricingFactor.m_backend.exp = iStack_98;
  (this->_solver).sparsePricingFactor.m_backend.neg = bStack_94;
  (this->_solver).sparsePricingFactor.m_backend.fpclass = (undefined4)local_90;
  (this->_solver).sparsePricingFactor.m_backend.prec_elem = local_90._4_4_;
  pSVar10 = this->_currentSettings;
  iVar8 = pSVar10->_intParamValues[0x14];
  if (iVar8 == 0) {
    (this->_solver).hyperPricingLeave = false;
    (this->_solver).hyperPricingEnter = false;
  }
  else if ((iVar8 == 2) ||
          ((iVar8 == 1 &&
           (5000 < (this->_solver).
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum +
                   (this->_solver).
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum)))) {
    (this->_solver).hyperPricingLeave = true;
    (this->_solver).hyperPricingEnter = true;
    DIdxSet::setMax(&(this->_solver).updateViols,(((this->_solver).thecovectors)->set).thenum);
    DIdxSet::setMax(&(this->_solver).updateViolsCo,(((this->_solver).thevectors)->set).thenum);
    pSVar10 = this->_currentSettings;
  }
  local_e0 = 0x1000000000;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  uStack_eb = 0;
  iStack_e8 = 0;
  bStack_e4 = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_128,pSVar10->_realParamValues[0x13]);
  *(undefined8 *)
   (this->_solver).
   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   .nonzeroFactor.m_backend.data._M_elems = local_128;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 2) = uStack_120;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 4) = local_118;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 6) = uStack_110;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 8) = local_108;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 10) = uStack_100;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 0xc) = local_f8;
  *(ulong *)((this->_solver).
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .nonzeroFactor.m_backend.data._M_elems + 0xe) = CONCAT35(uStack_eb,uStack_f0);
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .nonzeroFactor.m_backend.exp = iStack_e8;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .nonzeroFactor.m_backend.neg = bStack_e4;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .nonzeroFactor.m_backend.fpclass = (undefined4)local_e0;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .nonzeroFactor.m_backend.prec_elem = local_e0._4_4_;
  local_130 = 0x1000000000;
  local_178 = 0;
  uStack_170 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_148 = 0;
  uStack_140 = 0;
  uStack_13b = 0;
  iStack_138 = 0;
  bStack_134 = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_178,
             this->_currentSettings->_realParamValues[0x14]);
  *(undefined8 *)
   (this->_solver).
   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   .fillFactor.m_backend.data._M_elems = local_178;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 2) = uStack_170;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 4) = local_168;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 6) = uStack_160;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 8) = local_158;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 10) = uStack_150;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 0xc) = local_148;
  *(ulong *)((this->_solver).
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .fillFactor.m_backend.data._M_elems + 0xe) = CONCAT35(uStack_13b,uStack_140);
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .fillFactor.m_backend.exp = iStack_138;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .fillFactor.m_backend.neg = bStack_134;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .fillFactor.m_backend.fpclass = (undefined4)local_130;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .fillFactor.m_backend.prec_elem = local_130._4_4_;
  local_180 = 0x1000000000;
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_198 = 0;
  uStack_190 = 0;
  uStack_18c = 0;
  iStack_188 = 0;
  bStack_184 = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_1c8,
             this->_currentSettings->_realParamValues[0x15]);
  *(undefined8 *)
   (this->_solver).
   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   .memFactor.m_backend.data._M_elems = local_1c8;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memFactor.m_backend.data._M_elems + 2) = uStack_1c0;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[4] = (uint)local_1b8;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[5] = local_1b8._4_4_;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[6] = (uint)uStack_1b0;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[7] = uStack_1b0._4_4_;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[8] = (uint)local_1a8;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[9] = local_1a8._4_4_;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[10] = (uint)uStack_1a0;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[0xb] = uStack_1a0._4_4_;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[0xc] = (uint)local_198;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[0xd] = local_198._4_4_;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[0xe] = uStack_190;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[0xf] = uStack_18c;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.exp = iStack_188;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.neg = bStack_184;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.fpclass = (undefined4)local_180;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.prec_elem = local_180._4_4_;
  (*this->_statistics->simplexTime->_vptr_Timer[3])();
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::solve(this_00,interrupt,true);
  (*this->_statistics->simplexTime->_vptr_Timer[4])();
  iVar8 = (this->_solver).
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .iterCount;
  if ((0 < iVar8) && ((this->_rationalLUSolver).super_CLUFactorRational.stat != UNLOADED)) {
    SLUFactorRational::init(&this->_rationalLUSolver,(EVP_PKEY_CTX *)interrupt);
    iVar8 = (this->_solver).
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .iterCount;
  }
  pSVar4 = this->_statistics;
  pSVar4->iterations = pSVar4->iterations + iVar8;
  iVar11 = iVar8;
  if (iVar8 != 0) {
    iVar11 = (this->_solver).primalCount;
  }
  pSVar4->iterationsPrimal = pSVar4->iterationsPrimal + iVar11;
  iVar11 = 0;
  if (bVar13 != false) {
    iVar11 = iVar8;
  }
  pSVar4->iterationsFromBasis = pSVar4->iterationsFromBasis + iVar11;
  pSVar4->iterationsPolish = pSVar4->iterationsPolish + (this->_solver).polishCount;
  pSVar4->boundflips = pSVar4->boundflips + (this->_solver).totalboundflips;
  (*((this->_solver).multTimeSparse)->_vptr_Timer[6])();
  this->_statistics->multTimeSparse = extraout_XMM0_Qa_00 + this->_statistics->multTimeSparse;
  (*((this->_solver).multTimeFull)->_vptr_Timer[6])();
  this->_statistics->multTimeFull = extraout_XMM0_Qa_01 + this->_statistics->multTimeFull;
  (*((this->_solver).multTimeColwise)->_vptr_Timer[6])();
  this->_statistics->multTimeColwise = extraout_XMM0_Qa_02 + this->_statistics->multTimeColwise;
  (*((this->_solver).multTimeUnsetup)->_vptr_Timer[6])();
  pSVar4 = this->_statistics;
  pSVar4->multTimeUnsetup = extraout_XMM0_Qa_03 + pSVar4->multTimeUnsetup;
  iVar8 = (this->_solver).multFullCalls;
  iVar11 = (this->_solver).multColwiseCalls;
  iVar6 = (this->_solver).multUnsetupCalls;
  pSVar4->multSparseCalls = pSVar4->multSparseCalls + (this->_solver).multSparseCalls;
  pSVar4->multFullCalls = pSVar4->multFullCalls + iVar8;
  pSVar4->multColwiseCalls = pSVar4->multColwiseCalls + iVar11;
  pSVar4->multUnsetupCalls = pSVar4->multUnsetupCalls + iVar6;
  (*((this->_slufactor).
     super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .factorTime)->_vptr_Timer[6])();
  this->_statistics->luFactorizationTimeReal =
       extraout_XMM0_Qa_04 + this->_statistics->luFactorizationTimeReal;
  (*((this->_slufactor).solveTime)->_vptr_Timer[6])();
  pSVar4 = this->_statistics;
  pSVar4->luSolveTimeReal = extraout_XMM0_Qa_05 + pSVar4->luSolveTimeReal;
  pSVar4->luFactorizationsReal =
       pSVar4->luFactorizationsReal +
       (this->_slufactor).
       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .factorCount;
  pSVar4->luSolvesReal = pSVar4->luSolvesReal + (this->_slufactor).solveCount;
  (*((this->_slufactor).
     super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .factorTime)->_vptr_Timer[2])();
  (*((this->_slufactor).solveTime)->_vptr_Timer[2])();
  (this->_slufactor).
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .factorCount = 0;
  (this->_slufactor).
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .hugeValues = 0;
  (this->_slufactor).solveCount = 0;
  bVar13 = (this->_solver).theRep == ROW;
  pSVar4 = this->_statistics;
  pSVar4->degenPivotsPrimal =
       pSVar4->degenPivotsPrimal +
       *(int *)((long)(&(this->_solver).primalDegenSum.m_backend.data + -1) + 0x30 +
               (ulong)bVar13 * 4);
  pSVar4->degenPivotsDual =
       pSVar4->degenPivotsDual +
       *(int *)((long)(&(this->_solver).primalDegenSum.m_backend.data + -1) + 0x30 +
               (ulong)!bVar13 * 4);
  local_218.data._M_elems._0_8_ =
       *(undefined8 *)(this->_solver).dualDegenSum.m_backend.data._M_elems;
  local_218.data._M_elems._8_8_ =
       *(undefined8 *)((this->_solver).dualDegenSum.m_backend.data._M_elems + 2);
  local_218.data._M_elems._16_8_ =
       *(undefined8 *)((this->_solver).dualDegenSum.m_backend.data._M_elems + 4);
  local_218.data._M_elems._24_8_ =
       *(undefined8 *)((this->_solver).dualDegenSum.m_backend.data._M_elems + 6);
  local_218.data._M_elems._32_8_ =
       *(undefined8 *)((this->_solver).dualDegenSum.m_backend.data._M_elems + 8);
  local_218.data._M_elems._40_8_ =
       *(undefined8 *)((this->_solver).dualDegenSum.m_backend.data._M_elems + 10);
  local_218.data._M_elems._48_8_ =
       *(undefined8 *)((this->_solver).dualDegenSum.m_backend.data._M_elems + 0xc);
  uVar7 = *(undefined8 *)((this->_solver).dualDegenSum.m_backend.data._M_elems + 0xe);
  local_218.data._M_elems._56_5_ = SUB85(uVar7,0);
  local_218.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
  local_218.exp = (this->_solver).dualDegenSum.m_backend.exp;
  local_218.neg = (this->_solver).dualDegenSum.m_backend.neg;
  local_218.fpclass = (this->_solver).dualDegenSum.m_backend.fpclass;
  local_218.prec_elem = (this->_solver).dualDegenSum.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
            (&(pSVar4->sumDualDegen).m_backend,&local_218);
  local_218.data._M_elems._0_8_ =
       *(undefined8 *)(this->_solver).primalDegenSum.m_backend.data._M_elems;
  local_218.data._M_elems._8_8_ =
       *(undefined8 *)((this->_solver).primalDegenSum.m_backend.data._M_elems + 2);
  local_218.data._M_elems._16_8_ =
       *(undefined8 *)((this->_solver).primalDegenSum.m_backend.data._M_elems + 4);
  local_218.data._M_elems._24_8_ =
       *(undefined8 *)((this->_solver).primalDegenSum.m_backend.data._M_elems + 6);
  local_218.data._M_elems._32_8_ =
       *(undefined8 *)((this->_solver).primalDegenSum.m_backend.data._M_elems + 8);
  local_218.data._M_elems._40_8_ =
       *(undefined8 *)((this->_solver).primalDegenSum.m_backend.data._M_elems + 10);
  local_218.data._M_elems._48_8_ =
       *(undefined8 *)((this->_solver).primalDegenSum.m_backend.data._M_elems + 0xc);
  uVar7 = *(undefined8 *)((this->_solver).primalDegenSum.m_backend.data._M_elems + 0xe);
  local_218.data._M_elems._56_5_ = SUB85(uVar7,0);
  local_218.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
  local_218.exp = (this->_solver).primalDegenSum.m_backend.exp;
  local_218.neg = (this->_solver).primalDegenSum.m_backend.neg;
  local_218.fpclass = (this->_solver).primalDegenSum.m_backend.fpclass;
  local_218.prec_elem = (this->_solver).primalDegenSum.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
            (&(this->_statistics->sumPrimalDegen).m_backend,&local_218);
  return;
}

Assistant:

void SoPlexBase<R>::_solveRealLPAndRecordStatistics(volatile bool* interrupt)
{
   bool _hadBasis = _hasBasis;

   // set time and iteration limit
   if(intParam(SoPlexBase<R>::ITERLIMIT) < realParam(SoPlexBase<R>::INFTY))
      _solver.setTerminationIter(intParam(SoPlexBase<R>::ITERLIMIT) - _statistics->iterations);
   else
      _solver.setTerminationIter(-1);

   if(realParam(SoPlexBase<R>::TIMELIMIT) < realParam(SoPlexBase<R>::INFTY))
      _solver.setTerminationTime(Real(realParam(SoPlexBase<R>::TIMELIMIT)) -
                                 _statistics->solvingTime->time());
   else
      _solver.setTerminationTime(Real(realParam(SoPlexBase<R>::INFTY)));

   // ensure that tolerances are not too small
   R mintol = 1e4 * _solver.epsilon();

   if(this->tolerances()->floatingPointFeastol() < mintol)
      this->tolerances()->setFloatingPointFeastol(Real(mintol));

   if(this->tolerances()->floatingPointOpttol() < mintol)
      this->tolerances()->setFloatingPointOpttol(Real(mintol));

   // set correct representation
   if((intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_COLUMN
         || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
             && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) >=
             (_solver.nRows() + 1)))
         && _solver.rep() != SPxSolverBase<R>::COLUMN)
   {
      _solver.setRep(SPxSolverBase<R>::COLUMN);
   }
   else if((intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_ROW
            || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
                && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) < (_solver.nRows() + 1)))
           && _solver.rep() != SPxSolverBase<R>::ROW)
   {
      _solver.setRep(SPxSolverBase<R>::ROW);
   }

   // set correct type
   if(((intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_PRIMAL
         && _solver.rep() == SPxSolverBase<R>::COLUMN)
         || (intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_DUAL && _solver.rep() == SPxSolverBase<R>::ROW))
         && _solver.type() != SPxSolverBase<R>::ENTER)
   {
      _solver.setType(SPxSolverBase<R>::ENTER);
   }
   else if(((intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_DUAL
             && _solver.rep() == SPxSolverBase<R>::COLUMN)
            || (intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_PRIMAL
                && _solver.rep() == SPxSolverBase<R>::ROW))
           && _solver.type() != SPxSolverBase<R>::LEAVE)
   {
      _solver.setType(SPxSolverBase<R>::LEAVE);
   }

   // set pricing modes
   _solver.setSparsePricingFactor(realParam(SoPlexBase<R>::SPARSITY_THRESHOLD));

   if((intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_ON)
         || ((intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_AUTO)
             && (_solver.nRows() + _solver.nCols() > SOPLEX_HYPERPRICINGTHRESHOLD)))
      _solver.hyperPricing(true);
   else if(intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_OFF)
      _solver.hyperPricing(false);

   _solver.setNonzeroFactor(realParam(SoPlexBase<R>::REFAC_BASIS_NNZ));
   _solver.setFillFactor(realParam(SoPlexBase<R>::REFAC_UPDATE_FILL));
   _solver.setMemFactor(realParam(SoPlexBase<R>::REFAC_MEM_FACTOR));

   // call floating-point solver and catch exceptions
   _statistics->simplexTime->start();

   try
   {
      _solver.solve(interrupt);
   }
   catch(const SPxException& E)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught exception <" << E.what() << "> while solving Real LP.\n");
      _status = SPxSolverBase<R>::ERROR;
   }
   catch(...)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught unknown exception while solving Real LP.\n");
      _status = SPxSolverBase<R>::ERROR;
   }

   _statistics->simplexTime->stop();

   // invalidate rational factorization of basis if pivots have been performed
   if(_solver.iterations() > 0)
      _rationalLUSolver.clear();

   // record statistics
   _statistics->iterations += _solver.iterations();
   _statistics->iterationsPrimal += _solver.primalIterations();
   _statistics->iterationsFromBasis += _hadBasis ? _solver.iterations() : 0;
   _statistics->iterationsPolish += _solver.polishIterations();
   _statistics->boundflips += _solver.boundFlips();
   _statistics->multTimeSparse += _solver.multTimeSparse->time();
   _statistics->multTimeFull += _solver.multTimeFull->time();
   _statistics->multTimeColwise += _solver.multTimeColwise->time();
   _statistics->multTimeUnsetup += _solver.multTimeUnsetup->time();
   _statistics->multSparseCalls += _solver.multSparseCalls;
   _statistics->multFullCalls += _solver.multFullCalls;
   _statistics->multColwiseCalls += _solver.multColwiseCalls;
   _statistics->multUnsetupCalls += _solver.multUnsetupCalls;
   _statistics->luFactorizationTimeReal += _slufactor.getFactorTime();
   _statistics->luSolveTimeReal += _slufactor.getSolveTime();
   _statistics->luFactorizationsReal += _slufactor.getFactorCount();
   _statistics->luSolvesReal += _slufactor.getSolveCount();
   _slufactor.resetCounters();

   _statistics->degenPivotsPrimal += _solver.primalDegeneratePivots();
   _statistics->degenPivotsDual += _solver.dualDegeneratePivots();
   _statistics->sumDualDegen += _solver.sumDualDegeneracy();
   _statistics->sumPrimalDegen += _solver.sumPrimalDegeneracy();
}